

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
wabt::WastLexer::CreateBufferLexer(string_view filename,void *data,size_t size,Errors *errors)

{
  __uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true> in_RDI;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  unsigned_long local_38;
  vector<wabt::Error,_std::allocator<wabt::Error>_> *local_30 [2];
  
  std::make_unique<wabt::LexerSource,void_const*&,unsigned_long&>((void **)&local_50,&local_38);
  std::
  make_unique<wabt::WastLexer,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>,std::basic_string_view<char,std::char_traits<char>>&,std::vector<wabt::Error,std::allocator<wabt::Error>>*&>
            ((unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)
             in_RDI.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
             super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&local_50,local_30);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::~unique_ptr
            ((unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)&local_50);
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (tuple<wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>)
         in_RDI.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
         super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
         super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<WastLexer> WastLexer::CreateBufferLexer(
    std::string_view filename,
    const void* data,
    size_t size,
    Errors* errors) {
  return std::make_unique<WastLexer>(std::make_unique<LexerSource>(data, size),
                                     filename, errors);
}